

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O3

bool __thiscall
glcts::ShaderBitfieldOperationCaseUnaryUint::test
          (ShaderBitfieldOperationCaseUnaryUint *this,Data *data)

{
  GLuint GVar1;
  UnaryUFunc p_Var2;
  uint uVar3;
  long lVar4;
  
  if (0 < this->m_components) {
    p_Var2 = this->m_func;
    lVar4 = 0;
    do {
      GVar1 = (*p_Var2)(data->inUvec4[lVar4]);
      uVar3 = data->outUvec4[lVar4];
      p_Var2 = this->m_func;
      if ((((p_Var2 == findMSBI) || (p_Var2 == findMSBU)) || (p_Var2 == bitCount)) ||
         (p_Var2 == findLSB)) {
        uVar3 = (int)(uVar3 << 0x17) >> 0x1f & 0xfffffe00U | uVar3 & 0x1ff;
      }
    } while ((uVar3 == GVar1) && (lVar4 = lVar4 + 1, lVar4 < this->m_components));
    return uVar3 == GVar1;
  }
  return true;
}

Assistant:

virtual bool test(Data const* data)
	{
		for (int i = 0; i < m_components; ++i)
		{
			GLuint expected = m_func(data->inUvec4[i]);
			GLuint output   = data->outUvec4[i];
			if (m_func == (UnaryUFunc)glcts::bitCount || m_func == (UnaryUFunc)glcts::findLSB ||
				m_func == (UnaryUFunc)glcts::findMSBU || m_func == (UnaryUFunc)glcts::findMSBI)
			{
				/* The built-in bitCount, findLSB and findMSB functions
				 * return a lowp int, which can be encoded with as little
				 * as 9 bits. Since findLSB and findMSB can return negative
				 * values (namely, -1), we cannot compare the value directly
				 * against a (32-bit) GLuint.
				 */
				GLuint output_9bits = output & 0x1ff;
				GLuint sign_extend  = output_9bits & 0x100 ? 0xfffffe00 : 0;
				output				= output_9bits | sign_extend;
			}

			if (output != expected)
			{
				return false;
			}
		}
		return true;
	}